

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O0

void __thiscall
QOpenGLTextureBlitterPrivate::QOpenGLTextureBlitterPrivate
          (QOpenGLTextureBlitterPrivate *this,QOpenGLTextureBlitter *q_ptr)

{
  QOpenGLVertexArrayObject *pQVar1;
  QObject *parent;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Program *in_stack_ffffffffffffffc0;
  QScopedPointer<QOpenGLVertexArrayObject,_QScopedPointerDeleter<QOpenGLVertexArrayObject>_>
  *this_00;
  QOpenGLVertexArrayObject *local_18;
  
  *in_RDI = in_RSI;
  QOpenGLBuffer::QOpenGLBuffer((QOpenGLBuffer *)in_stack_ffffffffffffffc0);
  QOpenGLBuffer::QOpenGLBuffer((QOpenGLBuffer *)in_stack_ffffffffffffffc0);
  pQVar1 = (QOpenGLVertexArrayObject *)(in_RDI + 3);
  do {
    local_18 = pQVar1;
    Program::Program(in_stack_ffffffffffffffc0);
    pQVar1 = local_18 + 3;
  } while (local_18 + 3 != (QOpenGLVertexArrayObject *)(in_RDI + 0x15));
  *(undefined1 *)(in_RDI + 0x15) = 0;
  *(undefined4 *)((long)in_RDI + 0xac) = 0x3f800000;
  this_00 = (QScopedPointer<QOpenGLVertexArrayObject,_QScopedPointerDeleter<QOpenGLVertexArrayObject>_>
             *)(in_RDI + 0x16);
  parent = (QObject *)operator_new(0x10);
  QOpenGLVertexArrayObject::QOpenGLVertexArrayObject(local_18,parent);
  QScopedPointer<QOpenGLVertexArrayObject,_QScopedPointerDeleter<QOpenGLVertexArrayObject>_>::
  QScopedPointer(this_00,(QOpenGLVertexArrayObject *)parent);
  *(undefined4 *)(in_RDI + 0x17) = 0;
  return;
}

Assistant:

QOpenGLTextureBlitterPrivate(QOpenGLTextureBlitter *q_ptr) :
        q(q_ptr),
        swizzle(false),
        opacity(1.0f),
        vao(new QOpenGLVertexArrayObject),
        currentTarget(TEXTURE_2D)
    { }